

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::basic_param::cla_name_help
          (basic_param *this,ostream *ostr,cstring *cla_tag,cstring *param_3)

{
  unit_test::operator<<(ostr,cla_tag);
  return;
}

Assistant:

virtual void            cla_name_help( std::ostream& ostr, cstring cla_tag, cstring /* negation_prefix_ */) const
    {
        ostr << cla_tag;
    }